

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64 drwav_read_pcm_frames(drwav *pWav,drwav_uint64 framesToRead,void *pBufferOut)

{
  uint uVar1;
  drwav_uint64 dVar2;
  ulong uVar3;
  
  if (pBufferOut == (void *)0x0 || (framesToRead == 0 || pWav == (drwav *)0x0)) {
    return 0;
  }
  dVar2 = 0;
  if ((pWav->translatedFormatTag != 2) && (pWav->translatedFormatTag != 0x11)) {
    uVar1 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample;
    if ((uVar1 < 8) || ((uVar1 & 7) != 0)) {
      uVar1 = (uint)(pWav->fmt).blockAlign;
    }
    else {
      uVar1 = uVar1 >> 3;
    }
    if (uVar1 == 0) {
      dVar2 = 0;
    }
    else {
      uVar3 = framesToRead * uVar1;
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        if (pWav->bytesRemaining < uVar3) {
          uVar3 = pWav->bytesRemaining;
        }
        uVar3 = (*pWav->onRead)(pWav->pUserData,pBufferOut,uVar3);
        pWav->bytesRemaining = pWav->bytesRemaining - uVar3;
      }
      dVar2 = uVar3 / uVar1;
    }
  }
  return dVar2;
}

Assistant:

drwav_uint64 drwav_read_pcm_frames(drwav* pWav, drwav_uint64 framesToRead, void* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0 || pBufferOut == NULL) {
        return 0;
    }

    // Cannot use this function for compressed formats.
    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        return 0;
    }

    drwav_uint32 bytesPerFrame = drwav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }

    // Don't try to read more samples than can potentially fit in the output buffer.
    if (framesToRead * bytesPerFrame > DRWAV_SIZE_MAX) {
        framesToRead = DRWAV_SIZE_MAX / bytesPerFrame;
    }

    size_t bytesRead = drwav_read_raw(pWav, (size_t)(framesToRead * bytesPerFrame), pBufferOut);
    return bytesRead / bytesPerFrame;
}